

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_charset.hpp
# Opt level: O3

escape_value<char,_unsigned_short>
boost::xpressive::detail::
parse_escape<char_const*,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          (char **begin,char *end,
          compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *tr)

{
  byte bVar1;
  char_class_type cVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  char *pcVar7;
  range_check_result rVar8;
  unsigned_long line;
  ulong uVar9;
  bool cond;
  escape_value<char,_unsigned_short> eVar10;
  regex_error local_70;
  
  pcVar7 = *begin;
  if (pcVar7 == end) {
    std::runtime_error::runtime_error
              (&local_70.super_runtime_error,"unexpected end of pattern found");
    local_70.super_exception.data_.px_ = (error_info_container *)0x0;
    local_70._0_8_ = &PTR__regex_error_00193398;
    local_70.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_001933c0;
    local_70.code_ = error_escape;
    local_70.super_exception.throw_function_ =
         "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
    ;
    local_70.super_exception.throw_file_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
    ;
    local_70.super_exception.throw_line_ = 0x55;
    local_70.super_exception.throw_column_ = -1;
    throw_exception<boost::xpressive::regex_error>(&local_70);
  }
  cVar2 = cpp_regex_traits<char>::lookup_classname<char_const*>
                    ((cpp_regex_traits<char> *)tr,pcVar7,pcVar7 + 1,
                     SUB41((tr->flags_ & icase_) >> 1,0));
  if (cVar2 != 0) {
    uVar6 = (ulong)cVar2 | 0x200000000;
    uVar9 = 0;
    goto LAB_001325db;
  }
  iVar3 = cpp_regex_traits<char>::value((cpp_regex_traits<char> *)tr,**begin,8);
  if (iVar3 != -1) {
    uVar4 = toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      (begin,end,&tr->traits_,8,0x1ff);
    uVar9 = (ulong)uVar4;
    rVar8 = cNegOverflow;
    if (-1 < (int)uVar4) {
      rVar8 = (uint)(0xff < uVar4) * 2;
    }
    char_overflow_handler::operator()((char_overflow_handler *)&local_70,rVar8);
    goto switchD_00132612_caseD_62;
  }
  bVar1 = **begin;
  uVar9 = (ulong)bVar1;
  pbVar5 = (byte *)(*begin + 1);
  *begin = (char *)pbVar5;
  switch(bVar1) {
  case 0x61:
    uVar9 = 7;
    break;
  case 99:
    ensure_(pbVar5 != (byte *)end,error_escape,"unexpected end of pattern found",
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,0x77);
    ensure_((byte)((**begin & 0xdfU) + 0xbf) < 0x1a,error_escape,
            "invalid escape control letter; must be one of a-z or A-Z",
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,0x7e);
    uVar9 = (ulong)(byte)(**begin % ' ');
    char_overflow_handler::operator()
              ((char_overflow_handler *)&local_70,(uint)((byte)(**begin % ' ') >> 7));
    *begin = *begin + 1;
    break;
  case 0x65:
    uVar9 = 0x1b;
    break;
  case 0x66:
    uVar9 = 0xc;
    break;
  case 0x6e:
    uVar9 = 10;
    break;
  case 0x72:
    uVar9 = 0xd;
    break;
  case 0x74:
    uVar9 = 9;
    break;
  case 0x75:
    ensure_(pbVar5 != (byte *)end,error_escape,"unexpected end of pattern found",
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,0xa6);
    pcVar7 = *begin;
    uVar4 = toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      (begin,end,&tr->traits_,0x10,0xffff);
    rVar8 = cNegOverflow;
    if (-1 < (int)uVar4) {
      rVar8 = (uint)(0xff < uVar4) * 2;
    }
    char_overflow_handler::operator()((char_overflow_handler *)&local_70,rVar8);
    cond = (long)*begin - (long)pcVar7 == 4;
    pcVar7 = "invalid Unicode escape : must be \\u HexDigit HexDigit HexDigit HexDigit";
    line = 0xaa;
    goto LAB_001327f4;
  case 0x76:
    uVar9 = 0xb;
    break;
  case 0x78:
    ensure_(pbVar5 != (byte *)end,error_escape,"unexpected end of pattern found",
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,0x9e);
    pcVar7 = *begin;
    uVar4 = toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      (begin,end,&tr->traits_,0x10,0xff);
    rVar8 = cNegOverflow;
    if (-1 < (int)uVar4) {
      rVar8 = (uint)(0xff < uVar4) * 2;
    }
    char_overflow_handler::operator()((char_overflow_handler *)&local_70,rVar8);
    cond = (long)*begin - (long)pcVar7 == 2;
    pcVar7 = "invalid hex escape : must be \\x HexDigit HexDigit";
    line = 0xa2;
LAB_001327f4:
    uVar9 = (ulong)uVar4;
    ensure_(cond,error_escape,pcVar7,
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,line);
  }
switchD_00132612_caseD_62:
  uVar6 = 0;
LAB_001325db:
  eVar10._0_8_ = uVar9 & 0xff;
  eVar10.class_ = (short)uVar6;
  eVar10._10_2_ = (short)(uVar6 >> 0x10);
  eVar10.type_ = (int)(uVar6 >> 0x20);
  return eVar10;
}

Assistant:

escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type>
parse_escape(FwdIter &begin, FwdIter end, CompilerTraits &tr)
{
    using namespace regex_constants;
    typedef typename iterator_value<FwdIter>::type char_type;
    typedef typename CompilerTraits::regex_traits regex_traits;
    typedef typename regex_traits::char_class_type char_class_type;

    // define an unsigned type the same size as char_type
    typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
    BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
    typedef numeric::conversion_traits<uchar_t, int> converstion_traits;

    BOOST_XPR_ENSURE_(begin != end, error_escape, "unexpected end of pattern found");
    numeric::converter<int, uchar_t, converstion_traits, char_overflow_handler> converter;
    escape_value<char_type,char_class_type> esc = { 0, 0, 0, escape_char };
    bool const icase = (0 != (regex_constants::icase_ & tr.flags()));
    regex_traits const &rxtraits = tr.traits();
    FwdIter tmp;

    esc.class_ = rxtraits.lookup_classname(begin, begin + 1, icase);
    if(0 != esc.class_)
    {
        esc.type_ = escape_class;
        return esc;
    }

    if(-1 != rxtraits.value(*begin, 8))
    {
        esc.ch_ = converter(toi(begin, end, rxtraits, 8, 0777));
        return esc;
    }

    switch(*begin)
    {
    // bell character
    case BOOST_XPR_CHAR_(char_type, 'a'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\a');
        ++begin;
        break;
    // escape character
    case BOOST_XPR_CHAR_(char_type, 'e'):
        esc.ch_ = converter(27);
        ++begin;
        break;
    // control character
    case BOOST_XPR_CHAR_(char_type, 'c'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        BOOST_XPR_ENSURE_
        (
            rxtraits.in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *begin)
         || rxtraits.in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *begin)
          , error_escape
          , "invalid escape control letter; must be one of a-z or A-Z"
        );
        // Convert to character according to ECMA-262, section 15.10.2.10:
        esc.ch_ = converter(*begin % 32);
        ++begin;
        break;
    // formfeed character
    case BOOST_XPR_CHAR_(char_type, 'f'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\f');
        ++begin;
        break;
    // newline
    case BOOST_XPR_CHAR_(char_type, 'n'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\n');
        ++begin;
        break;
    // return
    case BOOST_XPR_CHAR_(char_type, 'r'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\r');
        ++begin;
        break;
    // horizontal tab
    case BOOST_XPR_CHAR_(char_type, 't'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\t');
        ++begin;
        break;
    // vertical tab
    case BOOST_XPR_CHAR_(char_type, 'v'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\v');
        ++begin;
        break;
    // hex escape sequence
    case BOOST_XPR_CHAR_(char_type, 'x'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        tmp = begin;
        esc.ch_ = converter(toi(begin, end, rxtraits, 16, 0xff));
        BOOST_XPR_ENSURE_(2 == std::distance(tmp, begin), error_escape, "invalid hex escape : "
            "must be \\x HexDigit HexDigit");
        break;
    // Unicode escape sequence
    case BOOST_XPR_CHAR_(char_type, 'u'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        tmp = begin;
        esc.ch_ = converter(toi(begin, end, rxtraits, 16, 0xffff));
        BOOST_XPR_ENSURE_(4 == std::distance(tmp, begin), error_escape, "invalid Unicode escape : "
            "must be \\u HexDigit HexDigit HexDigit HexDigit");
        break;
    // backslash
    case BOOST_XPR_CHAR_(char_type, '\\'):
        //esc.ch_ = BOOST_XPR_CHAR_(char_type, '\\');
        //++begin;
        //break;
    // all other escaped characters represent themselves
    default:
        esc.ch_ = *begin;
        ++begin;
        break;
    }

    return esc;
}